

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<char>::resizeImpl<slang::SmallVectorBase<char>::DefaultInitTag>
          (SmallVectorBase<char> *this,size_type newSize,DefaultInitTag *val)

{
  iterator pcVar1;
  DefaultInitTag *in_RSI;
  SmallVectorBase<char> *in_RDI;
  SmallVectorBase<char> *unaff_retaddr;
  DefaultInitTag temp;
  char *in_stack_ffffffffffffffc8;
  __uninitialized_default_construct_n_fn *in_stack_ffffffffffffffd0;
  __destroy_fn *in_stack_ffffffffffffffe0;
  
  if (in_RSI < (DefaultInitTag *)in_RDI->len) {
    pcVar1 = begin(in_RDI);
    pcVar1 = pcVar1 + (long)in_RSI;
    end(in_RDI);
    std::ranges::__destroy_fn::operator()<char_*,_char_*>
              (in_stack_ffffffffffffffe0,(char *)in_RDI,pcVar1);
    in_RDI->len = (size_type)in_RSI;
  }
  else if ((DefaultInitTag *)in_RDI->len < in_RSI) {
    if ((DefaultInitTag *)in_RDI->cap < in_RSI) {
      resizeRealloc<slang::SmallVectorBase<char>::DefaultInitTag>
                (unaff_retaddr,(size_type)in_RDI,in_RSI);
    }
    else {
      end(in_RDI);
      std::ranges::__uninitialized_default_construct_n_fn::operator()<char_*>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0xebaee7);
      in_RDI->len = (size_type)in_RSI;
    }
  }
  return;
}

Assistant:

void resizeImpl(size_type newSize, const TVal& val) {
        if (newSize < len) {
            std::ranges::destroy(begin() + newSize, end());
            len = newSize;
            return;
        }

        if (newSize > len) {
            if (newSize > cap) {
                // Copy the value in case it's inside our existing array.
                TVal temp(val);
                resizeRealloc(newSize, temp);
                return;
            }

            if constexpr (std::is_same_v<T, TVal>) {
                std::ranges::uninitialized_fill_n(end(), ptrdiff_t(newSize - len), val);
            }
            else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
                std::ranges::uninitialized_default_construct_n(end(), ptrdiff_t(newSize - len));
            }
            else {
                std::ranges::uninitialized_value_construct_n(end(), ptrdiff_t(newSize - len));
            }
            len = newSize;
        }
    }